

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_next_url(char **globbed,URLGlob *glob)

{
  URLPatternType UVar1;
  size_t sVar2;
  CURLcode CVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  curl_off_t *pcVar7;
  char cVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  
  sVar2 = glob->urllen;
  pcVar12 = glob->glob_buffer;
  *globbed = (char *)0x0;
  if (glob->beenhere == '\0') {
    glob->beenhere = '\x01';
  }
  else {
    bVar13 = true;
    lVar4 = -1;
    uVar6 = 0;
    while (bVar13) {
      if (glob->size <= uVar6) {
        return CURLE_OK;
      }
      lVar9 = glob->size + lVar4;
      UVar1 = glob->pattern[lVar9].type;
      if (UVar1 == UPTNumRange) {
        lVar11 = glob->pattern[lVar9].content.NumRange.ptr_n +
                 glob->pattern[lVar9].content.NumRange.step;
        glob->pattern[lVar9].content.NumRange.ptr_n = lVar11;
        if (lVar11 <= glob->pattern[lVar9].content.Set.size) goto LAB_0011ca77;
        glob->pattern[lVar9].content.NumRange.ptr_n =
             (curl_off_t)glob->pattern[lVar9].content.Set.elements;
LAB_0011ca72:
        bVar13 = true;
      }
      else {
        if (UVar1 == UPTCharRange) {
          cVar8 = glob->pattern[lVar9].content.CharRange.ptr_c +
                  *(char *)((long)&glob->pattern[lVar9].content + 4);
          glob->pattern[lVar9].content.CharRange.ptr_c = cVar8;
          if (glob->pattern[lVar9].content.CharRange.max_c < cVar8) {
            glob->pattern[lVar9].content.CharRange.ptr_c =
                 glob->pattern[lVar9].content.CharRange.min_c;
            goto LAB_0011ca72;
          }
        }
        else {
          if (UVar1 != UPTSet) goto LAB_0011cb5d;
          if (glob->pattern[lVar9].content.Set.elements != (char **)0x0) {
            lVar11 = (long)glob->pattern[lVar9].content.Set.ptr_s + 1;
            bVar13 = glob->pattern[lVar9].content.Set.size == lVar11;
            iVar10 = (int)lVar11;
            if (bVar13) {
              iVar10 = 0;
            }
            glob->pattern[lVar9].content.Set.ptr_s = iVar10;
            goto LAB_0011ca79;
          }
        }
LAB_0011ca77:
        bVar13 = false;
      }
LAB_0011ca79:
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + -1;
    }
  }
  lVar4 = sVar2 + 1;
  pcVar7 = &glob->pattern[0].content.NumRange.ptr_n;
  uVar6 = 0;
  do {
    if (glob->size <= uVar6) {
      pcVar12 = strdup(glob->glob_buffer);
      *globbed = pcVar12;
      CVar3 = CURLE_OUT_OF_MEMORY;
      if (pcVar12 != (char *)0x0) {
        CVar3 = CURLE_OK;
      }
      return CVar3;
    }
    iVar10 = *(int *)(pcVar7 + -4);
    if (iVar10 == 3) {
      curl_msnprintf(pcVar12,lVar4,"%0*ld",*(int *)(pcVar7 + -1),*pcVar7);
LAB_0011cb1a:
      sVar5 = strlen(pcVar12);
      pcVar12 = pcVar12 + sVar5;
      lVar4 = lVar4 - sVar5;
    }
    else if (iVar10 == 2) {
      if (lVar4 == 0) {
        lVar4 = 0;
      }
      else {
        *pcVar12 = *(char *)((long)pcVar7 + -0x16);
        pcVar12[1] = '\0';
        pcVar12 = pcVar12 + 1;
        lVar4 = lVar4 + -1;
      }
    }
    else {
      if (iVar10 != 1) {
LAB_0011cb5d:
        curl_mprintf("internal error: invalid pattern type (%d)\n");
        return CURLE_FAILED_INIT;
      }
      if (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar7 + -3))->min_n != 0) {
        curl_msnprintf(pcVar12,lVar4,"%s",
                       *(undefined8 *)
                        (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar7 + -3))->min_n +
                        (long)*(int *)(pcVar7 + -1) * 8));
        goto LAB_0011cb1a;
      }
    }
    uVar6 = uVar6 + 1;
    pcVar7 = pcVar7 + 6;
  } while( true );
}

Assistant:

CURLcode glob_next_url(char **globbed, struct URLGlob *glob)
{
  struct URLPattern *pat;
  size_t i;
  size_t len;
  size_t buflen = glob->urllen + 1;
  char *buf = glob->glob_buffer;

  *globbed = NULL;

  if(!glob->beenhere)
    glob->beenhere = 1;
  else {
    bool carry = TRUE;

    /* implement a counter over the index ranges of all patterns, starting
       with the rightmost pattern */
    for(i = 0; carry && (i < glob->size); i++) {
      carry = FALSE;
      pat = &glob->pattern[glob->size - 1 - i];
      switch(pat->type) {
      case UPTSet:
        if((pat->content.Set.elements) &&
           (++pat->content.Set.ptr_s == pat->content.Set.size)) {
          pat->content.Set.ptr_s = 0;
          carry = TRUE;
        }
        break;
      case UPTCharRange:
        pat->content.CharRange.ptr_c =
          (char)(pat->content.CharRange.step +
                 (int)((unsigned char)pat->content.CharRange.ptr_c));
        if(pat->content.CharRange.ptr_c > pat->content.CharRange.max_c) {
          pat->content.CharRange.ptr_c = pat->content.CharRange.min_c;
          carry = TRUE;
        }
        break;
      case UPTNumRange:
        pat->content.NumRange.ptr_n += pat->content.NumRange.step;
        if(pat->content.NumRange.ptr_n > pat->content.NumRange.max_n) {
          pat->content.NumRange.ptr_n = pat->content.NumRange.min_n;
          carry = TRUE;
        }
        break;
      default:
        printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
        return CURLE_FAILED_INIT;
      }
    }
    if(carry) {         /* first pattern ptr has run into overflow, done! */
      return CURLE_OK;
    }
  }

  for(i = 0; i < glob->size; ++i) {
    pat = &glob->pattern[i];
    switch(pat->type) {
    case UPTSet:
      if(pat->content.Set.elements) {
        msnprintf(buf, buflen, "%s",
                  pat->content.Set.elements[pat->content.Set.ptr_s]);
        len = strlen(buf);
        buf += len;
        buflen -= len;
      }
      break;
    case UPTCharRange:
      if(buflen) {
        *buf++ = pat->content.CharRange.ptr_c;
        *buf = '\0';
        buflen--;
      }
      break;
    case UPTNumRange:
      msnprintf(buf, buflen, "%0*" CURL_FORMAT_CURL_OFF_T,
                pat->content.NumRange.padlength,
                pat->content.NumRange.ptr_n);
      len = strlen(buf);
      buf += len;
      buflen -= len;
      break;
    default:
      printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
      return CURLE_FAILED_INIT;
    }
  }

  *globbed = strdup(glob->glob_buffer);
  if(!*globbed)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}